

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O3

void __thiscall QUndoStack::setIndex(QUndoStack *this,int idx)

{
  long i;
  QUndoStackPrivate *this_00;
  ulong uVar1;
  byte bVar2;
  QUndoCommand *pQVar3;
  long lVar4;
  int iVar5;
  int idx_00;
  ulong uVar6;
  
  this_00 = *(QUndoStackPrivate **)&this->field_0x8;
  if ((this_00->macro_stack).d.size != 0) {
    setIndex();
    return;
  }
  if (idx < 0) {
    uVar6 = 0;
  }
  else {
    uVar1 = (this_00->command_list).d.size;
    uVar6 = uVar1 & 0xffffffff;
    if ((uint)idx <= uVar1) {
      uVar6 = (ulong)(uint)idx;
    }
  }
  iVar5 = this_00->index;
  idx_00 = (int)uVar6;
  if (iVar5 < idx_00) {
    do {
      pQVar3 = (this_00->command_list).d.ptr[iVar5];
      bVar2 = pQVar3->d->obsolete;
      if ((bool)bVar2 == false) {
        (*pQVar3->_vptr_QUndoCommand[3])(pQVar3);
        bVar2 = pQVar3->d->obsolete;
      }
      if ((bVar2 & 1) == 0) {
        iVar5 = iVar5 + 1;
      }
      else {
        pQVar3 = QList<QUndoCommand_*>::takeAt(&this_00->command_list,(long)iVar5);
        if (pQVar3 != (QUndoCommand *)0x0) {
          (*pQVar3->_vptr_QUndoCommand[1])(pQVar3);
        }
        if (iVar5 < this_00->clean_index) {
          resetClean(this);
        }
        uVar6 = (ulong)((int)uVar6 - 1);
      }
      idx_00 = (int)uVar6;
    } while (iVar5 < idx_00);
  }
  if (idx_00 < iVar5) {
    lVar4 = (long)iVar5;
    do {
      i = lVar4 + -1;
      pQVar3 = (this_00->command_list).d.ptr[lVar4 + -1];
      (*pQVar3->_vptr_QUndoCommand[2])(pQVar3);
      if (pQVar3->d->obsolete == true) {
        pQVar3 = QList<QUndoCommand_*>::takeAt(&this_00->command_list,i);
        if (pQVar3 != (QUndoCommand *)0x0) {
          (*pQVar3->_vptr_QUndoCommand[1])(pQVar3);
        }
        if (lVar4 <= this_00->clean_index) {
          resetClean(this);
        }
      }
      lVar4 = i;
    } while (idx_00 < i);
  }
  QUndoStackPrivate::setIndex(this_00,idx_00,false);
  return;
}

Assistant:

void QUndoStack::setIndex(int idx)
{
    Q_D(QUndoStack);
    if (Q_UNLIKELY(!d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::setIndex(): cannot set index in the middle of a macro");
        return;
    }

    if (idx < 0)
        idx = 0;
    else if (idx > d->command_list.size())
        idx = d->command_list.size();

    int i = d->index;
    while (i < idx) {
        QUndoCommand *cmd = d->command_list.at(i);

        if (!cmd->isObsolete())
            cmd->redo();  // A separate check is done b/c the undo command may set obsolete flag

        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();

            idx--; // Subtract from idx because we removed a command
        } else {
            i++;
        }
    }

    while (i > idx) {
        QUndoCommand *cmd = d->command_list.at(--i);

        cmd->undo();
        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();
        }
    }

    d->setIndex(idx, false);
}